

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedOffsetTable.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_orderedOffsetTableBuilder_finish(sysbvm_context_t *context,sysbvm_tuple_t builder)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_orderedOffsetTable_t *result;
  size_t size;
  sysbvm_orderedOffsetTableBuilder_t *builderObject;
  sysbvm_tuple_t builder_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_orderedCollection_getSize(*(sysbvm_tuple_t *)(builder + 0x10));
  if (sVar1 == 0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_context_allocatePointerTuple(context,(context->roots).orderedOffsetTableType,2);
    sVar2 = sysbvm_orderedCollection_asWordArray(context,*(sysbvm_tuple_t *)(builder + 0x10));
    ((anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
    &(context_local->heap).shouldAttemptToCollect)->pointers[0] = sVar2;
    sVar2 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(builder + 0x18));
    (context_local->heap).totalSize = sVar2;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedOffsetTableBuilder_finish(sysbvm_context_t *context, sysbvm_tuple_t builder)
{
    sysbvm_orderedOffsetTableBuilder_t *builderObject = (sysbvm_orderedOffsetTableBuilder_t*)builder;
    size_t size = sysbvm_orderedCollection_getSize(builderObject->keys);
    if(!size)
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedOffsetTable_t *result = (sysbvm_orderedOffsetTable_t*)sysbvm_context_allocatePointerTuple(context, context->roots.orderedOffsetTableType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_orderedOffsetTable_t));
    result->keys = sysbvm_orderedCollection_asWordArray(context, builderObject->keys);
    result->values = sysbvm_orderedCollection_asArray(context, builderObject->values);
    return (sysbvm_tuple_t)result;
}